

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O3

void Ssw_ManDumpEquivMiter(Aig_Man_t *p,Vec_Int_t *vPairs,int Num,int fAddOuts)

{
  FILE *__stream;
  Aig_Man_t *pMan;
  undefined4 in_register_00000014;
  int level;
  char pBuffer [16];
  char acStack_38 [24];
  
  level = (int)acStack_38;
  sprintf(acStack_38,"equiv%03d.aig",CONCAT44(in_register_00000014,Num));
  __stream = fopen(acStack_38,"w");
  if (__stream == (FILE *)0x0) {
    Abc_Print(level,"Cannot open file %s for writing.\n",acStack_38);
  }
  else {
    fclose(__stream);
    pMan = Saig_ManCreateEquivMiter(p,vPairs,fAddOuts);
    Ioa_WriteAiger(pMan,acStack_38,0,0);
    Aig_ManStop(pMan);
    Abc_Print((int)pMan,"AIG with %4d disproved equivs is dumped into file \"%s\".\n",
              (ulong)(uint)(vPairs->nSize / 2),acStack_38);
  }
  return;
}

Assistant:

void Ssw_ManDumpEquivMiter( Aig_Man_t * p, Vec_Int_t * vPairs, int Num, int fAddOuts )
{
    FILE * pFile;
    char pBuffer[16];
    Aig_Man_t * pNew;
    sprintf( pBuffer, "equiv%03d.aig", Num );
    pFile = fopen( pBuffer, "w" );
    if ( pFile == NULL )
    {
        Abc_Print( 1, "Cannot open file %s for writing.\n", pBuffer );
        return;
    }
    fclose( pFile );
    pNew = Saig_ManCreateEquivMiter( p, vPairs, fAddOuts );
    Ioa_WriteAiger( pNew, pBuffer, 0, 0 );
    Aig_ManStop( pNew );
    Abc_Print( 1, "AIG with %4d disproved equivs is dumped into file \"%s\".\n", Vec_IntSize(vPairs)/2, pBuffer );
}